

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

bool __thiscall
google::protobuf::TextFormat::Printer::RegisterFieldValuePrinter
          (Printer *this,FieldDescriptor *field,FieldValuePrinter *printer)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  pair<std::_Rb_tree_iterator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>,_bool>
  pVar3;
  pair<const_google::protobuf::FieldDescriptor_*,_std::nullptr_t> local_40;
  
  if (printer != (FieldValuePrinter *)0x0 && field != (FieldDescriptor *)0x0) {
    p_Var2 = (_Base_ptr)operator_new(0x10);
    *(undefined ***)p_Var2 = &PTR__FieldValuePrinterWrapper_003bc500;
    p_Var2->_M_parent = (_Base_ptr)0x0;
    local_40.second = (void *)0x0;
    local_40.first = field;
    pVar3 = std::
            _Rb_tree<google::protobuf::FieldDescriptor_const*,std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>,std::_Select1st<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>>
            ::
            _M_emplace_unique<std::pair<google::protobuf::FieldDescriptor_const*,decltype(nullptr)>>
                      ((_Rb_tree<google::protobuf::FieldDescriptor_const*,std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>,std::_Select1st<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>,std::less<google::protobuf::FieldDescriptor_const*>,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>>
                        *)&this->custom_printers_,&local_40);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      p_Var2->_M_parent = (_Base_ptr)printer;
      p_Var1 = pVar3.first._M_node._M_node[1]._M_parent;
      pVar3.first._M_node._M_node[1]._M_parent = p_Var2;
      if (p_Var1 == (_Base_ptr)0x0) {
        return true;
      }
      (**(code **)(*(long *)p_Var1 + 8))();
      return true;
    }
    operator_delete(p_Var2);
  }
  return false;
}

Assistant:

bool TextFormat::Printer::RegisterFieldValuePrinter(
    const FieldDescriptor* field, const FieldValuePrinter* printer) {
  if (field == nullptr || printer == nullptr) {
    return false;
  }
  std::unique_ptr<FieldValuePrinterWrapper> wrapper(
      new FieldValuePrinterWrapper(nullptr));
  auto pair = custom_printers_.insert(std::make_pair(field, nullptr));
  if (pair.second) {
    wrapper->SetDelegate(printer);
    pair.first->second = std::move(wrapper);
    return true;
  } else {
    return false;
  }
}